

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

void __thiscall
pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>::GeneralMedium
          (GeneralMedium<pbrt::NanoVDBMediumProvider> *this,NanoVDBMediumProvider *provider,
          SpectrumHandle *sigma_a,SpectrumHandle *sigma_s,Float sigScale,Float g,
          Transform *renderFromMedium,Allocator alloc)

{
  undefined8 uVar1;
  Bounds3f *pBVar2;
  DenselySampledSpectrum *in_RDX;
  NanoVDBMediumProvider *in_RSI;
  undefined8 *in_RDI;
  undefined1 (*in_R8) [64];
  Allocator in_R9;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined4 in_XMM0_Da;
  Float in_XMM1_Da;
  SpectrumHandle *in_stack_ffffffffffffff18;
  SpectrumHandle *in_stack_ffffffffffffff20;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar5;
  Transform *in_stack_ffffffffffffff30;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *other;
  Allocator alloc_00;
  Point3i *in_stack_ffffffffffffffa8;
  NanoVDBMediumProvider *in_stack_ffffffffffffffb0;
  
  *in_RDI = in_RSI;
  pBVar2 = NanoVDBMediumProvider::Bounds(in_RSI);
  in_RDI[3] = *(undefined8 *)&(pBVar2->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  uVar1 = *(undefined8 *)&(pBVar2->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  in_RDI[1] = *(undefined8 *)&(pBVar2->pMin).super_Tuple3<pbrt::Point3,_float>;
  in_RDI[2] = uVar1;
  alloc_00.memoryResource = (memory_resource *)(in_RDI + 4);
  SpectrumHandle::SpectrumHandle(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  DenselySampledSpectrum::DenselySampledSpectrum
            (in_RDX,(SpectrumHandle *)in_stack_ffffffffffffff30,alloc_00);
  SpectrumHandle::SpectrumHandle(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  DenselySampledSpectrum::DenselySampledSpectrum
            (in_RDX,(SpectrumHandle *)in_stack_ffffffffffffff30,alloc_00);
  *(undefined4 *)(in_RDI + 0xe) = in_XMM0_Da;
  HGPhaseFunction::HGPhaseFunction((HGPhaseFunction *)((long)in_RDI + 0x74),in_XMM1_Da);
  Inverse(in_stack_ffffffffffffff30);
  auVar3 = vmovdqu64_avx512f(*in_R8);
  auVar4 = vmovdqu64_avx512f(in_R8[1]);
  auVar4 = vmovdqu64_avx512f(auVar4);
  *(undefined1 (*) [64])(in_RDI + 0x27) = auVar4;
  auVar4 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])(in_RDI + 0x1f) = auVar4;
  pvVar5 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x2f);
  other = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&stack0xffffffffffffff90;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<float> *)other,(polymorphic_allocator<std::byte> *)pvVar5);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector(pvVar5,&other->alloc);
  pvVar5 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x33);
  Point3<int>::Point3((Point3<int> *)0x743c1f);
  NanoVDBMediumProvider::GetMaxDensityGrid
            (in_stack_ffffffffffffffb0,in_R9,in_stack_ffffffffffffffa8);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_RDX,other);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(pvVar5);
  return;
}

Assistant:

GeneralMedium(const DensityProvider *provider, SpectrumHandle sigma_a,
                  SpectrumHandle sigma_s, Float sigScale, Float g,
                  const Transform &renderFromMedium, Allocator alloc)
        : provider(provider),
          mediumBounds(provider->Bounds()),
          sigma_a_spec(sigma_a, alloc),
          sigma_s_spec(sigma_s, alloc),
          sigScale(sigScale),
          phase(g),
          mediumFromRender(Inverse(renderFromMedium)),
          renderFromMedium(renderFromMedium),
          maxDensityGrid(alloc) {
        maxDensityGrid = provider->GetMaxDensityGrid(alloc, &gridResolution);
    }